

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void Function_Pool::BitwiseXor
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height)

{
  FunctionTask *in_stack_00000008;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  uint32_t startX2_00;
  Image *in_stack_fffffffffffffe70;
  uint32_t in_stack_fffffffffffffe78;
  uint32_t in_stack_fffffffffffffe7c;
  Image *in_stack_fffffffffffffe80;
  FunctionTask *in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffeb0;
  Image *in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffec0;
  uint32_t in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffed8;
  
  startX2_00 = (uint32_t)((ulong)&stack0xfffffffffffffe80 >> 0x20);
  FunctionTask::FunctionTask
            ((FunctionTask *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  FunctionTask::BitwiseXor
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,startX2_00,
             in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffec0,
             in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
  FunctionTask::~FunctionTask(in_stack_00000008);
  return;
}

Assistant:

void BitwiseXor( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                     Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        FunctionTask().BitwiseXor( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
    }